

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastMdR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  TcParseTableBase *pTVar6;
  bool bVar7;
  uint uVar8;
  MessageLite *pMVar9;
  ulong uVar10;
  EpsCopyInputStream *pEVar11;
  char *pcVar12;
  string *psVar13;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar14;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  int iVar15;
  long lVar16;
  EpsCopyInputStream *ptr_00;
  uint *puVar17;
  pair<const_char_*,_int> pVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  EpsCopyInputStream *local_58 [2];
  EpsCopyInputStream *local_48;
  TcParseTableBase *local_40;
  TcParseTableBase *local_38;
  
  if (data.field_0._0_2_ != 0) {
    pcVar12 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar12;
  }
  local_48 = (EpsCopyInputStream *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)local_48 & 7) != 0) {
    AlignFail(local_48);
  }
  uVar2 = *(ushort *)ptr;
  local_38 = MessageLite::GetTcParseTable
                       (*(MessageLite **)
                         ((long)&table->has_bits_offset +
                         ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset));
  local_40 = local_38 + 1;
  while( true ) {
    ptr_00 = local_48;
    pMVar9 = AddMessage(local_38,(RepeatedPtrFieldBase *)local_48);
    bVar1 = *(byte *)((long)&((EpsCopyInputStream *)ptr)->limit_end_ + 2);
    aVar14.data._1_7_ = 0;
    aVar14.data._0_1_ = bVar1;
    if ((char)bVar1 < '\0') {
      ptr_00 = (EpsCopyInputStream *)(ulong)(uint)bVar1;
      pVar18 = ReadSizeFallback((char *)((long)&((EpsCopyInputStream *)ptr)->limit_end_ + 2),
                                (uint)bVar1);
      auVar19._8_8_ = pVar18._8_8_;
      auVar19._0_8_ = local_58[0];
      if (pVar18.first == (char *)0x0) break;
      aVar14.data = pVar18._8_8_ & 0xffffffff;
    }
    else {
      pVar18._8_8_ = extraout_RDX;
      pVar18.first = (char *)((long)&((EpsCopyInputStream *)ptr)->limit_end_ + 3);
    }
    auVar19._8_8_ = pVar18._8_8_;
    auVar19._0_8_ = local_58[0];
    if (ctx->depth_ < 1) break;
    EpsCopyInputStream::PushLimit((EpsCopyInputStream *)local_58,(char *)ctx,(int)pVar18.first);
    pTVar6 = local_40;
    iVar5 = (int)local_58[0];
    lVar16 = (long)ctx->depth_ + -1;
    iVar15 = (int)lVar16;
    ctx->depth_ = iVar15;
    local_58[0] = (EpsCopyInputStream *)pVar18.first;
    while( true ) {
      ptr_00 = (EpsCopyInputStream *)local_58;
      bVar7 = EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)local_58,ctx->group_depth_);
      auVar19._8_8_ = extraout_RDX_00;
      auVar19._0_8_ = local_58[0];
      if (bVar7) break;
      uVar8 = (uint)pTVar6[-1].fast_idx_mask & (uint)*(ushort *)&local_58[0]->limit_end_;
      if ((uVar8 & 7) != 0) goto LAB_0014d5d2;
      uVar10 = (ulong)(uVar8 & 0xfffffff8);
      aVar14.data = (ulong)*(ushort *)&local_58[0]->limit_end_ ^
                    *(ulong *)(&pTVar6->fast_idx_mask + uVar10 * 2);
      auVar19 = (**(code **)(&pTVar6->has_bits_offset + uVar10))
                          (pMVar9,local_58[0],ctx,aVar14.data,pTVar6 + -1,0);
      ptr_00 = local_58[0];
      if ((auVar19._0_8_ == (EpsCopyInputStream *)0x0) ||
         (local_58[0] = auVar19._0_8_, (ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
      break;
    }
    local_58[0] = auVar19._0_8_;
    ptr = (char *)local_58[0];
    if ((pTVar6[-1].field_0x9 & 1) != 0) {
      ptr_00 = local_58[0];
      auVar20 = (undefined1  [16])(*pTVar6[-1].post_loop_handler)(pMVar9,(char *)local_58[0],ctx);
      auVar19._8_8_ = auVar20._8_8_;
      auVar19._0_8_ = local_58[0];
      ptr = (char *)auVar20._0_8_;
    }
    local_58[0] = auVar19._0_8_;
    iVar4 = ctx->depth_;
    if (((EpsCopyInputStream *)ptr != (EpsCopyInputStream *)0x0) && (iVar15 != iVar4)) {
      psVar13 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                          (lVar16,(long)iVar4,"old_depth == depth_");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_58,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                 ,1099,*(undefined8 *)(psVar13 + 8),*(undefined8 *)psVar13);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_58);
    }
    ctx->depth_ = iVar4 + 1;
    uVar8 = iVar5 + (ctx->super_EpsCopyInputStream).limit_;
    (ctx->super_EpsCopyInputStream).limit_ = uVar8;
    if ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0) break;
    pEVar11 = (EpsCopyInputStream *)
              ((ctx->super_EpsCopyInputStream).buffer_end_ + (int)((int)uVar8 >> 0x1f & uVar8));
    (ctx->super_EpsCopyInputStream).limit_end_ = (char *)pEVar11;
    if ((EpsCopyInputStream *)ptr == (EpsCopyInputStream *)0x0) break;
    if (pEVar11 <= ptr) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar17 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar17 & 3) != 0) {
          AlignFail();
        }
        *puVar17 = *puVar17 | (uint)hasbits;
      }
      return (char *)(EpsCopyInputStream *)ptr;
    }
    uVar3 = *(ushort *)&((EpsCopyInputStream *)ptr)->limit_end_;
    if (uVar3 != uVar2) {
      uVar8 = (uint)table->fast_idx_mask & (uint)uVar3;
      if ((uVar8 & 7) == 0) {
        uVar10 = (ulong)(uVar8 & 0xfffffff8);
        pcVar12 = (char *)(**(code **)(&table[1].has_bits_offset + uVar10))
                                    (msg,ptr,ctx,
                                     (ulong)uVar3 ^ *(ulong *)(&table[1].fast_idx_mask + uVar10 * 2)
                                     ,table,hasbits);
        return pcVar12;
      }
LAB_0014d5d2:
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
  }
  local_58[0] = auVar19._0_8_;
  pcVar12 = Error(msg,(char *)ptr_00,auVar19._8_8_,(TcFieldData)aVar14,table,hasbits);
  return pcVar12;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastMdR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint16_t, false, false>(
      PROTOBUF_TC_PARAM_PASS);
}